

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.c++
# Opt level: O1

void __thiscall
kj::StringTree::StringTree(StringTree *this,Array<kj::StringTree> *pieces,StringPtr delim)

{
  size_t sVar1;
  ArrayDisposer *pAVar2;
  StringTree *pSVar3;
  Branch *pBVar4;
  Branch *pBVar5;
  long lVar6;
  char *pcVar7;
  size_t sVar8;
  size_t __n;
  ulong uVar9;
  uint uVar10;
  String local_48;
  
  (this->text).content.size_ = 0;
  (this->text).content.disposer = (ArrayDisposer *)0x0;
  this->size_ = 0;
  (this->text).content.ptr = (char *)0x0;
  sVar1 = pieces->size_;
  pBVar5 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,sVar1,sVar1,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      construct,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      destruct);
  (this->branches).ptr = pBVar5;
  (this->branches).size_ = sVar1;
  (this->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  sVar1 = pieces->size_;
  if (sVar1 != 0) {
    if ((sVar1 != 1) && (lVar6 = delim.content.size_ - 1, lVar6 != 0)) {
      heapString(&local_48,(sVar1 - 1) * lVar6);
      pcVar7 = (this->text).content.ptr;
      if (pcVar7 != (char *)0x0) {
        sVar1 = (this->text).content.size_;
        (this->text).content.ptr = (char *)0x0;
        (this->text).content.size_ = 0;
        pAVar2 = (this->text).content.disposer;
        (*(code *)**(undefined8 **)pAVar2)(pAVar2,pcVar7,1,sVar1,sVar1,0);
      }
      (this->text).content.ptr = local_48.content.ptr;
      (this->text).content.size_ = local_48.content.size_;
      (this->text).content.disposer = local_48.content.disposer;
      sVar1 = (this->text).content.size_;
      sVar8 = 0;
      if (sVar1 != 0) {
        sVar8 = sVar1 - 1;
      }
      this->size_ = sVar8;
    }
    pBVar5 = (this->branches).ptr;
    pBVar5->index = 0;
    pSVar3 = pieces->ptr;
    (pBVar5->content).size_ = pSVar3->size_;
    pcVar7 = (pBVar5->content).text.content.ptr;
    if (pcVar7 != (char *)0x0) {
      sVar1 = (pBVar5->content).text.content.size_;
      (pBVar5->content).text.content.ptr = (char *)0x0;
      (pBVar5->content).text.content.size_ = 0;
      pAVar2 = (pBVar5->content).text.content.disposer;
      (*(code *)**(undefined8 **)pAVar2)(pAVar2,pcVar7,1,sVar1,sVar1,0);
    }
    (pBVar5->content).text.content.ptr = (pSVar3->text).content.ptr;
    (pBVar5->content).text.content.size_ = (pSVar3->text).content.size_;
    (pBVar5->content).text.content.disposer = (pSVar3->text).content.disposer;
    (pSVar3->text).content.ptr = (char *)0x0;
    (pSVar3->text).content.size_ = 0;
    pBVar4 = (pBVar5->content).branches.ptr;
    if (pBVar4 != (Branch *)0x0) {
      sVar1 = (pBVar5->content).branches.size_;
      (pBVar5->content).branches.ptr = (Branch *)0x0;
      (pBVar5->content).branches.size_ = 0;
      pAVar2 = (pBVar5->content).branches.disposer;
      (*(code *)**(undefined8 **)pAVar2)
                (pAVar2,pBVar4,0x40,sVar1,sVar1,
                 ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    (pBVar5->content).branches.ptr = (pSVar3->branches).ptr;
    (pBVar5->content).branches.size_ = (pSVar3->branches).size_;
    (pBVar5->content).branches.disposer = (pSVar3->branches).disposer;
    (pSVar3->branches).ptr = (Branch *)0x0;
    (pSVar3->branches).size_ = 0;
    this->size_ = this->size_ + pieces->ptr->size_;
    if (1 < pieces->size_) {
      __n = delim.content.size_ - 1;
      uVar9 = 1;
      uVar10 = 2;
      do {
        if (__n != 0) {
          pcVar7 = (char *)(this->text).content.size_;
          if (pcVar7 != (char *)0x0) {
            pcVar7 = (this->text).content.ptr;
          }
          memcpy(pcVar7 + (uVar10 - 2) * __n,delim.content.ptr,__n);
        }
        pBVar5 = (this->branches).ptr;
        pBVar5[uVar9].index = uVar9 * __n;
        pSVar3 = pieces->ptr;
        pBVar5[uVar9].content.size_ = pSVar3[uVar9].size_;
        pcVar7 = pBVar5[uVar9].content.text.content.ptr;
        if (pcVar7 != (char *)0x0) {
          sVar1 = pBVar5[uVar9].content.text.content.size_;
          pBVar5[uVar9].content.text.content.ptr = (char *)0x0;
          pBVar5[uVar9].content.text.content.size_ = 0;
          pAVar2 = pBVar5[uVar9].content.text.content.disposer;
          (*(code *)**(undefined8 **)pAVar2)(pAVar2,pcVar7,1,sVar1,sVar1,0);
        }
        pBVar5[uVar9].content.text.content.ptr = pSVar3[uVar9].text.content.ptr;
        pBVar5[uVar9].content.text.content.size_ = pSVar3[uVar9].text.content.size_;
        pBVar5[uVar9].content.text.content.disposer = pSVar3[uVar9].text.content.disposer;
        pSVar3[uVar9].text.content.ptr = (char *)0x0;
        pSVar3[uVar9].text.content.size_ = 0;
        pBVar4 = pBVar5[uVar9].content.branches.ptr;
        if (pBVar4 != (Branch *)0x0) {
          sVar1 = pBVar5[uVar9].content.branches.size_;
          pBVar5[uVar9].content.branches.ptr = (Branch *)0x0;
          pBVar5[uVar9].content.branches.size_ = 0;
          pAVar2 = pBVar5[uVar9].content.branches.disposer;
          (*(code *)**(undefined8 **)pAVar2)(pAVar2,pBVar4,0x40,sVar1,sVar1);
        }
        pBVar5[uVar9].content.branches.ptr = pSVar3[uVar9].branches.ptr;
        pBVar5[uVar9].content.branches.size_ = pSVar3[uVar9].branches.size_;
        pBVar5[uVar9].content.branches.disposer = pSVar3[uVar9].branches.disposer;
        pSVar3[uVar9].branches.ptr = (Branch *)0x0;
        pSVar3[uVar9].branches.size_ = 0;
        this->size_ = this->size_ + pieces->ptr[uVar9].size_;
        uVar9 = (ulong)uVar10;
        uVar10 = uVar10 + 1;
      } while (uVar9 < pieces->size_);
    }
  }
  return;
}

Assistant:

StringTree::StringTree(Array<StringTree>&& pieces, StringPtr delim)
    : size_(0),
      branches(heapArray<Branch>(pieces.size())) {
  if (pieces.size() > 0) {
    if (pieces.size() > 1 && delim.size() > 0) {
      text = heapString((pieces.size() - 1) * delim.size());
      size_ = text.size();
    }

    branches[0].index = 0;
    branches[0].content = kj::mv(pieces[0]);
    size_ += pieces[0].size();

    for (uint i = 1; i < pieces.size(); i++) {
      if (delim.size() > 0) {
        memcpy(text.begin() + (i - 1) * delim.size(), delim.begin(), delim.size());
      }
      branches[i].index = i * delim.size();
      branches[i].content = kj::mv(pieces[i]);
      size_ += pieces[i].size();
    }
  }
}